

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void * TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
       ThreadWork(void *voidptr)

{
  TPZDohrAssembleList<std::complex<double>_> *this;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> data;
  TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_> local_58;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> local_50;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> local_38;
  
  PopItem(&local_50,
          (TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
           *)voidptr);
  while ((local_50.fSubStructure.fRef != (TPZReference *)0x0 &&
         ((local_50.fSubStructure.fRef)->fPointer != (TPZDohrSubstruct<std::complex<double>_> *)0x0)
         )) {
    TPZDohrSubstruct<std::complex<double>_>::Contribute_v2_local
              ((local_50.fSubStructure.fRef)->fPointer,(local_50.fInput_local.fRef)->fPointer,
               &(local_50.fv2_local.fRef)->fPointer->fAssembleData);
    this = (TPZDohrAssembleList<std::complex<double>_> *)**(undefined8 **)((long)voidptr + 0x40);
    local_58.fRef = local_50.fv2_local.fRef;
    LOCK();
    ((local_50.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_50.fv2_local.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZDohrAssembleList<std::complex<double>_>::AddItem(this,&local_58);
    TPZAutoPointer<TPZDohrAssembleItem<std::complex<double>_>_>::~TPZAutoPointer(&local_58);
    PopItem(&local_38,
            (TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
             *)voidptr);
    TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
    operator=(&local_50,&local_38);
    TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
    ~TPZDohrPrecondV2SubData(&local_38);
  }
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
  ~TPZDohrPrecondV2SubData(&local_50);
  return voidptr;
}

Assistant:

void *TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork(void *voidptr)
{
	TPZDohrPrecondV2SubDataList<TVar,TSubStruct>	*myptr = (TPZDohrPrecondV2SubDataList<TVar,TSubStruct> *) voidptr;
	TPZDohrPrecondV2SubData<TVar,TSubStruct> data = myptr->PopItem();
	while (data.IsValid()) {
		data.fSubStructure->Contribute_v2_local(data.fInput_local,data.fv2_local->fAssembleData);
		myptr->fAssemblyStructure->AddItem(data.fv2_local);
		data = myptr->PopItem();
	}
	return voidptr;
}